

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

void x9_62_free_context(st_x9_62_keyex_context_t *ctx)

{
  free((ctx->super).pubkey.base);
  if ((EC_KEY *)ctx->privkey != (EC_KEY *)0x0) {
    EC_KEY_free((EC_KEY *)ctx->privkey);
  }
  if ((BN_CTX *)ctx->bn_ctx != (BN_CTX *)0x0) {
    BN_CTX_free((BN_CTX *)ctx->bn_ctx);
  }
  free(ctx);
  return;
}

Assistant:

static void x9_62_free_context(struct st_x9_62_keyex_context_t *ctx)
{
    free(ctx->super.pubkey.base);
    if (ctx->privkey != NULL)
        EC_KEY_free(ctx->privkey);
    if (ctx->bn_ctx != NULL)
        BN_CTX_free(ctx->bn_ctx);
    free(ctx);
}